

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

pointer __thiscall
google::protobuf::RepeatedField<unsigned_long>::AddNAlreadyReserved
          (RepeatedField<unsigned_long> *this,int n)

{
  int iVar1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar2;
  unsigned_long *puVar3;
  unsigned_long *end;
  unsigned_long *begin;
  unsigned_long *p;
  LogMessage local_40;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int capacity;
  int old_size;
  bool is_soo;
  RepeatedField<unsigned_long> *pRStack_10;
  int n_local;
  RepeatedField<unsigned_long> *this_local;
  
  old_size = n;
  pRStack_10 = this;
  capacity._3_1_ = RepeatedField<unsigned_long>::is_soo(this);
  absl_log_internal_check_op_result._4_4_ = size(this,(bool)capacity._3_1_);
  absl_log_internal_check_op_result._0_4_ = Capacity(this,(bool)(capacity._3_1_ & 1));
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue
                    ((int)absl_log_internal_check_op_result -
                     absl_log_internal_check_op_result._4_4_);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(old_size);
  local_28 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,v2,"capacity - old_size >= n");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x307,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(int)absl_log_internal_check_op_result);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [3])0x6f1e63)
    ;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,absl_log_internal_check_op_result._4_4_);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  puVar3 = unsafe_elements(this,(bool)(capacity._3_1_ & 1));
  iVar1 = ExchangeCurrentSize(this,(bool)(capacity._3_1_ & 1),
                              absl_log_internal_check_op_result._4_4_ + old_size);
  puVar3 = puVar3 + iVar1;
  for (end = puVar3; end != puVar3 + old_size; end = end + 1) {
  }
  return puVar3;
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  [[maybe_unused]] const int capacity = Capacity(is_soo);
  ABSL_DCHECK_GE(capacity - old_size, n) << capacity << ", " << old_size;
  Element* p =
      unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + n);
  for (Element *begin = p, *end = p + n; begin != end; ++begin) {
    new (static_cast<void*>(begin)) Element;
  }
  return p;
}